

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O3

int Hop_NodeCompareLevelsDecrease(Hop_Obj_t **pp1,Hop_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x20) >> 6;
  uVar3 = *(uint *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x20) >> 6;
  if (uVar4 <= uVar3) {
    if ((int)(uVar4 - uVar3) < 0) {
      return 1;
    }
    iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x24);
    iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x24);
    if (iVar2 <= iVar1) {
      return (int)(iVar2 != iVar1);
    }
  }
  return -1;
}

Assistant:

int Hop_NodeCompareLevelsDecrease( Hop_Obj_t ** pp1, Hop_Obj_t ** pp2 )
{
    int Diff = Hop_ObjLevel(Hop_Regular(*pp1)) - Hop_ObjLevel(Hop_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Hop_Regular(*pp1)->Id - Hop_Regular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}